

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

int genaInitNotifyExt(UpnpDevice_Handle device_handle,char *UDN,char *servId,IXML_Document *PropSet,
                     char *sid)

{
  char *propertySet_00;
  char *propertySet;
  int line;
  int ret;
  char *sid_local;
  IXML_Document *PropSet_local;
  char *servId_local;
  char *UDN_local;
  UpnpDevice_Handle device_handle_local;
  
  propertySet._0_4_ = 0;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x2d4,"GENA BEGIN INITIAL NOTIFY EXT\n");
  if (PropSet == (IXML_Document *)0x0) {
    propertySet._0_4_ = 0x2d8;
    propertySet._4_4_ = 0;
  }
  else {
    propertySet_00 = (char *)ixmlPrintNode(PropSet);
    if (propertySet_00 == (char *)0x0) {
      propertySet._0_4_ = 0x2df;
      propertySet._4_4_ = 0xffffff9b;
    }
    else {
      UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x2e6,
                 "GENERATED PROPERTY SET IN INIT EXT NOTIFY: %s\n",propertySet_00);
      propertySet._4_4_ = genaInitNotifyCommon(device_handle,UDN,servId,propertySet_00,sid);
    }
  }
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",(int)propertySet,
             "GENA END INITIAL NOTIFY EXT, ret = %d\n",(ulong)propertySet._4_4_);
  return propertySet._4_4_;
}

Assistant:

int genaInitNotifyExt(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	IXML_Document *PropSet,
	const Upnp_SID sid)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	DOMString propertySet = NULL;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN INITIAL NOTIFY EXT\n");

	if (PropSet == 0) {
		line = __LINE__;
		ret = GENA_SUCCESS;
		goto ExitFunction;
	}

	propertySet = ixmlPrintNode((IXML_Node *)PropSet);
	if (propertySet == NULL) {
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto ExitFunction;
	}
	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENERATED PROPERTY SET IN INIT EXT NOTIFY: %s\n",
		propertySet);

	ret = genaInitNotifyCommon(
		device_handle, UDN, servId, propertySet, sid);

ExitFunction:

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END INITIAL NOTIFY EXT, ret = %d\n",
		ret);

	return ret;
}